

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O2

char * __thiscall CVmStringSource::read_line(CVmStringSource *this,char *buf,size_t len)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = this->memlen;
  lVar3 = this->pos;
  pcVar2 = buf;
  if (lVar3 == lVar4) {
    buf = (char *)0x0;
  }
  else {
    while( true ) {
      if ((lVar4 <= lVar3) || (len == 0)) goto LAB_00203f8b;
      cVar1 = this->mem[lVar3];
      if ((cVar1 == '\r') || (cVar1 == '\n')) break;
      this->pos = lVar3 + 1;
      *pcVar2 = this->mem[lVar3];
      len = len - 1;
      lVar4 = this->memlen;
      lVar3 = this->pos;
      pcVar2 = pcVar2 + 1;
    }
    *pcVar2 = '\n';
    pcVar2 = pcVar2 + 1;
    len = len - 1;
    lVar3 = this->pos;
    lVar4 = lVar3 + 1;
    this->pos = lVar4;
    if (((lVar4 < this->memlen) && (this->mem[lVar3] == '\r')) && (this->mem[lVar4] == '\n')) {
      this->pos = lVar3 + 2;
    }
LAB_00203f8b:
    if (len != 0) {
      *pcVar2 = '\0';
      return buf;
    }
  }
  return buf;
}

Assistant:

virtual char *read_line(char *buf, size_t len)
    {
        /* if we have no bytes left, return null for EOF */
        if (pos == memlen)
            return 0;
        
        /* read bytes until we encounter a CR, LF, or CR-LF */
        char *dst = buf;
        while (pos < memlen && len > 0)
        {
            /* check for a line terminator */
            if (mem[pos] == 10 || mem[pos] == 13)
            {
                /* 
                 *   add a newline to the result (it's always '\n' in the
                 *   result buffer regardless of the type of newline in the
                 *   source) 
                 */
                *dst++ = '\n';
                --len;

                /* 
                 *   if this is a CR-LF sequence, skip both characters;
                 *   otherwise just skip the single CR or LF
                 */
                ++pos;
                if (pos < memlen && mem[pos-1] == 13 && mem[pos] == 10)
                    ++pos;

                /* we're done */
                break;
            }

            /* copy this byte */
            *dst++ = mem[pos++];

            /* count it against the remaining buffer length */
            --len;
        }

        /* add a null terminator if possible */
        if (len != 0)
            *dst = '\0';

        /* return the original buffer pointer */
        return buf;
    }